

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall gnl::ThreadPool::finish(ThreadPool *this)

{
  bool bVar1;
  __shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  __normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
  local_28;
  iterator i;
  unique_lock<std::mutex> lock;
  ThreadPool *this_local;
  
  while( true ) {
    bVar1 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::empty
                      (&this->taskQueue);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    usleep(100);
  }
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&i,&this->mu);
  this->running = false;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&i);
  local_28._M_current =
       (shared_ptr<std::thread> *)
       std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
       begin(&this->threads);
  while( true ) {
    local_30._M_current =
         (shared_ptr<std::thread> *)
         std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
         end(&this->threads);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
              ::operator*(&local_28);
    std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (this_00);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<std::thread>_*,_std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void ThreadPool::finish()
{
	while(!taskQueue.empty()){
		//缓冲队列还有任务，则等待执行完成
		usleep(100);	//休眠100毫秒
	}
	{
		std::unique_lock<std::mutex> lock(mu);
		running = false;
		empty.notify_all();		//唤醒所有线程
	}
	//等待每一个线程退出
	for(std::vector<std::shared_ptr<std::thread>>::iterator i = threads.begin();
					i != threads.end(); ++i)
	{
		(*i)->join();
	}

}